

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O0

bool density_tests::detail::
     PutTestObject<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)1>,_256UL,_128UL>
     ::put(conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
           *queue,EasyRandom *i_rand)

{
  int32_t iVar1;
  EasyRandom *in_RSI;
  lf_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)1>
  *in_RDI;
  ElementType source;
  runtime_type<> type;
  TestObject<256UL,_128UL> local_380;
  runtime_type local_218 [3];
  TestObject<256UL,_128UL> local_200;
  lf_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)1>
  *local_98;
  
  local_98 = in_RDI;
  iVar1 = EasyRandom::get_bool(in_RSI,0.9);
  if (iVar1 == 0) {
    local_218[0].m_feature_table =
         (tuple_type *)density::runtime_type<>::make<density_tests::TestObject<256ul,128ul>>();
    TestObject<256UL,_128UL>::TestObject(&local_380);
    density::
    lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
    ::dyn_push_copy((lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                     *)local_98,local_218,&local_380);
    TestObject<256UL,_128UL>::~TestObject(&local_380);
  }
  else {
    TestObject<256UL,_128UL>::TestObject(&local_200);
    density::
    lf_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)1>
    ::push<density_tests::TestObject<256ul,128ul>>(local_98,&local_200);
    TestObject<256UL,_128UL>::~TestObject(&local_200);
  }
  return true;
}

Assistant:

static bool put(QUEUE & queue, EasyRandom & i_rand)
            {
                if (i_rand.get_bool(.9))
                {
                    queue.push(ElementType());
                }
                else
                {
                    auto        type = QUEUE::runtime_type::template make<ElementType>();
                    ElementType source;
                    queue.dyn_push_copy(type, &source);
                }
                return true;
            }